

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O2

vector<field::GF2E,_std::allocator<field::GF2E>_> *
anon_unknown.dwarf_39dbd::phase_2_expand
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *h_2,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *forbidden_values,size_t num_chall)

{
  uint8_t *data;
  pointer pGVar1;
  bool bVar2;
  size_t e;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  GF2E candidate_R;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lambda_sized_buffer;
  hash_context ctx;
  undefined8 local_160;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  hash_context local_140;
  
  hash_init(&local_140,(ulong)instance->digest_size);
  data = (h_2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  hash_update(&local_140,data,
              (long)(h_2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)data);
  hash_final(&local_140);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,
             (ulong)instance->lambda,(allocator_type *)&local_160);
  (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar3 = 0;
LAB_0010945c:
  if (sVar3 == num_chall) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_158);
    return __return_storage_ptr__;
  }
  do {
    hash_squeeze(&local_140,local_158._M_impl.super__Vector_impl_data._M_start,
                 (long)local_158._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158._M_impl.super__Vector_impl_data._M_start);
    local_160 = 0;
    field::GF2E::from_bytes((GF2E *)&local_160,local_158._M_impl.super__Vector_impl_data._M_start);
    uVar5 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      pGVar1 = (forbidden_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
      if ((ulong)((long)(forbidden_values->
                        super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pGVar1 >> 3) <= uVar5) {
        std::vector<field::GF2E,_std::allocator<field::GF2E>_>::push_back
                  (__return_storage_ptr__,(value_type *)&local_160);
        sVar3 = sVar3 + 1;
        goto LAB_0010945c;
      }
      bVar2 = field::GF2E::operator==((GF2E *)&local_160,(GF2E *)((long)&pGVar1->data + lVar4));
      lVar4 = lVar4 + 8;
    } while (!bVar2);
  } while( true );
}

Assistant:

std::vector<field::GF2E> phase_2_expand(
    const limbo_instance_t &instance, const std::vector<uint8_t> &h_2,
    const std::vector<field::GF2E> &forbidden_values, const size_t num_chall) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, h_2.data(), h_2.size());
  hash_final(&ctx);

  std::vector<uint8_t> lambda_sized_buffer(instance.lambda);
  std::vector<field::GF2E> R_es;
  for (size_t e = 0; e < num_chall; e++) { // instance.num_rounds; e++) {
    while (true) {
      hash_squeeze(&ctx, lambda_sized_buffer.data(),
                   lambda_sized_buffer.size());
      //  check that R is not in {0,...m2-1}
      field::GF2E candidate_R;
      candidate_R.from_bytes(lambda_sized_buffer.data());
      bool good = true;
      for (size_t k = 0; k < forbidden_values.size(); k++) {
        if (candidate_R == forbidden_values[k]) {
          good = false;
          break;
        }
      }
      if (good) {
        R_es.push_back(candidate_R);
        break;
      }
    }
  }
  return R_es;
}